

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.h
# Opt level: O0

void comp_mask_pred_8_ssse3
               (uint8_t *comp_pred,int height,uint8_t *src0,int stride0,uint8_t *src1,int stride1,
               uint8_t *mask,int mask_stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int in_ECX;
  ulong *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  ulong *in_R8;
  int in_R9D;
  __m128i ma;
  __m128i ssB;
  __m128i ssA;
  __m128i a;
  __m128i sB1;
  __m128i sB0;
  __m128i aA;
  __m128i sA1;
  __m128i sA0;
  __m128i round_offset;
  __m128i alpha_max;
  int i;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  int local_2c8;
  ulong *local_2c0;
  ulong *local_2b0;
  undefined8 *local_2a0;
  __m128i round;
  __m128i roundB;
  __m128i roundA;
  __m128i blendB;
  __m128i blendA;
  __m128i aaB;
  __m128i aaA;
  
  local_2c8 = 0;
  auVar1 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar1 = vpinsrb_avx(auVar1,0x40,2);
  auVar1 = vpinsrb_avx(auVar1,0x40,3);
  auVar1 = vpinsrb_avx(auVar1,0x40,4);
  auVar1 = vpinsrb_avx(auVar1,0x40,5);
  auVar1 = vpinsrb_avx(auVar1,0x40,6);
  auVar1 = vpinsrb_avx(auVar1,0x40,7);
  auVar1 = vpinsrb_avx(auVar1,0x40,8);
  auVar1 = vpinsrb_avx(auVar1,0x40,9);
  auVar1 = vpinsrb_avx(auVar1,0x40,10);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xb);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xd);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xe);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xf);
  auVar2 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar2 = vpinsrw_avx(auVar2,0x200,2);
  auVar2 = vpinsrw_avx(auVar2,0x200,3);
  auVar2 = vpinsrw_avx(auVar2,0x200,4);
  auVar2 = vpinsrw_avx(auVar2,0x200,5);
  auVar2 = vpinsrw_avx(auVar2,0x200,6);
  auVar2 = vpinsrw_avx(auVar2,0x200,7);
  local_2c0 = in_R8;
  local_2b0 = in_RDX;
  local_2a0 = in_RDI;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)ma[1];
    auVar3._8_8_ = *(undefined8 *)(ma[1] + (int)ssB[0]);
    auVar3._0_8_ = *(undefined8 *)(ma[1] + (int)ssB[0]);
    auVar7 = vunpcklpd_avx(auVar7,auVar3);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *local_2b0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *local_2c0;
    auVar4 = vpunpcklbw_avx(auVar8,auVar4);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)((long)local_2b0 + (long)in_ECX);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)((long)local_2c0 + (long)in_R9D);
    auVar5 = vpunpcklbw_avx(auVar6,auVar5);
    auVar3 = vpsubb_avx(auVar1,auVar7);
    auVar6 = vpunpcklbw_avx(auVar7,auVar3);
    auVar7 = vpunpckhbw_avx(auVar7,auVar3);
    auVar3 = vpmaddubsw_avx(auVar4,auVar6);
    auVar7 = vpmaddubsw_avx(auVar5,auVar7);
    auVar3 = vpmulhrsw_avx(auVar3,auVar2);
    auVar7 = vpmulhrsw_avx(auVar7,auVar2);
    auVar3 = vpackuswb_avx(auVar3,auVar7);
    local_3e8 = auVar3._0_8_;
    uStack_3e0 = auVar3._8_8_;
    *local_2a0 = local_3e8;
    local_2a0[1] = uStack_3e0;
    local_2a0 = local_2a0 + 2;
    local_2b0 = (ulong *)((long)local_2b0 + (long)(in_ECX << 1));
    local_2c0 = (ulong *)((long)local_2c0 + (long)(in_R9D << 1));
    ma[1] = ma[1] + ((int)ssB[0] << 1);
    local_2c8 = local_2c8 + 2;
  } while (local_2c8 < in_ESI);
  return;
}

Assistant:

static inline void comp_mask_pred_8_ssse3(uint8_t *comp_pred, int height,
                                          const uint8_t *src0, int stride0,
                                          const uint8_t *src1, int stride1,
                                          const uint8_t *mask,
                                          int mask_stride) {
  int i = 0;
  const __m128i alpha_max = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i round_offset =
      _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  do {
    // odd line A
    const __m128i sA0 = _mm_loadl_epi64((const __m128i *)(src0));
    const __m128i sA1 = _mm_loadl_epi64((const __m128i *)(src1));
    const __m128i aA = _mm_loadl_epi64((const __m128i *)(mask));
    // even line B
    const __m128i sB0 = _mm_loadl_epi64((const __m128i *)(src0 + stride0));
    const __m128i sB1 = _mm_loadl_epi64((const __m128i *)(src1 + stride1));
    const __m128i a = _mm_castps_si128(_mm_loadh_pi(
        _mm_castsi128_ps(aA), (const __m64 *)(mask + mask_stride)));

    const __m128i ssA = _mm_unpacklo_epi8(sA0, sA1);
    const __m128i ssB = _mm_unpacklo_epi8(sB0, sB1);

    const __m128i ma = _mm_sub_epi8(alpha_max, a);
    const __m128i aaA = _mm_unpacklo_epi8(a, ma);
    const __m128i aaB = _mm_unpackhi_epi8(a, ma);

    const __m128i blendA = _mm_maddubs_epi16(ssA, aaA);
    const __m128i blendB = _mm_maddubs_epi16(ssB, aaB);
    const __m128i roundA = _mm_mulhrs_epi16(blendA, round_offset);
    const __m128i roundB = _mm_mulhrs_epi16(blendB, round_offset);
    const __m128i round = _mm_packus_epi16(roundA, roundB);
    // comp_pred's stride == width == 8
    _mm_store_si128((__m128i *)(comp_pred), round);
    comp_pred += (8 << 1);
    src0 += (stride0 << 1);
    src1 += (stride1 << 1);
    mask += (mask_stride << 1);
    i += 2;
  } while (i < height);
}